

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall
SolverAppOptionParserTest_AMPLOption_Test::~SolverAppOptionParserTest_AMPLOption_Test
          (SolverAppOptionParserTest_AMPLOption_Test *this)

{
  SolverAppOptionParserTest::~SolverAppOptionParserTest(&this->super_SolverAppOptionParserTest);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(SolverAppOptionParserTest, AMPLOption) {
  EXPECT_EQ(0, solver_.wantsol());
  Args args("unused", "problem", "-AMPL");
  char **argp = args, **argp_copy = argp;
  EXPECT_STREQ("problem", parser_.Parse(argp_copy));
  EXPECT_EQ(argp + 3, argp_copy);
  EXPECT_EQ(1, solver_.wantsol());
}